

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O1

void __thiscall
KDIS::KDataStream::KDataStream
          (KDataStream *this,KOCTET *SerialData,KUINT16 DataSize,Endian Network_Endian)

{
  undefined8 in_RAX;
  undefined2 in_register_00000012;
  ulong uVar1;
  undefined8 uStack_38;
  
  this->m_NetEndian = Network_Endian;
  (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  uStack_38 = in_RAX;
  if (CONCAT22(in_register_00000012,DataSize) != 0) {
    uVar1 = 0;
    do {
      uStack_38 = CONCAT17(SerialData[uVar1],(undefined7)uStack_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->m_vBuffer,(uchar *)((long)&uStack_38 + 7));
      uVar1 = uVar1 + 1;
    } while (DataSize != uVar1);
  }
  if (UTILS::IsMachineBigEndian()::conv == '\0') {
    KDIS::KDataStream();
  }
  this->m_MachineEndian = (uint)(UTILS::IsMachineBigEndian()::conv != '\x01');
  return;
}

Assistant:

KDataStream::KDataStream( KOCTET * SerialData, KUINT16 DataSize, Endian Network_Endian /*= Big_Endian */ ) :
    m_NetEndian( Network_Endian ),
    m_ui16CurrentWritePos( 0 )
{
    // Copy Data into vector
    for( KUINT16 i = 0; i < DataSize; ++i )
    {
        m_vBuffer.push_back( SerialData[i] );
    }

    if( IsMachineBigEndian() == true )
    {
        m_MachineEndian = Big_Endian;
    }
    else
    {
        m_MachineEndian = Little_Endian;
    }
}